

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O2

O3DGCErrorCode o3dgc::SaveBinData(Vector<long> *data,BinaryStream *bstream)

{
  unsigned_long position;
  unsigned_long value;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  position = (bstream->m_stream).m_size;
  BinaryStream::WriteUInt32ASCII(bstream,0);
  value = data->m_size;
  BinaryStream::WriteUInt32ASCII(bstream,value);
  uVar3 = 0;
  while (uVar3 < value) {
    lVar1 = 0;
    for (uVar2 = 0; (uVar2 < 7 && (uVar2 + uVar3 < value)); uVar2 = uVar2 + 1) {
      lVar1 = lVar1 + (data->m_buffer[uVar3 + uVar2] << ((byte)uVar2 & 0x3f));
    }
    BinaryStream::WriteUCharASCII(bstream,(uchar)lVar1);
    uVar3 = uVar2 + uVar3;
  }
  BinaryStream::WriteUInt32ASCII(bstream,position,(bstream->m_stream).m_size - position);
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    SaveBinData(const Vector<long> & data,
                                  BinaryStream & bstream) 
    {
        unsigned long start = bstream.GetSize();
        bstream.WriteUInt32ASCII(0);
        const unsigned long size = data.GetSize();
        long symbol;
        bstream.WriteUInt32ASCII(size);
        for(unsigned long i = 0; i < size; )
        {
            symbol = 0;
            for(unsigned long h = 0; h < O3DGC_BINARY_STREAM_BITS_PER_SYMBOL0 && i < size; ++h)
            {
                symbol += (data[i] << h);
                ++i;
            }
            bstream.WriteUCharASCII((unsigned char) symbol);
        }
        bstream.WriteUInt32ASCII(start, bstream.GetSize() - start);
        return O3DGC_OK;
    }